

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_long,unsigned_int,12>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (unsigned_long *lhs,uint *rhs,uint *result)

{
  uint *in_RSI;
  ulong *in_RDI;
  unsigned_long tmp;
  uint *in_stack_ffffffffffffffd8;
  
  if ((ulong)*in_RSI <= *in_RDI) {
    SafeCastHelper<unsigned_int,unsigned_long,2>::
    CastThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              (*in_RDI - (ulong)*in_RSI,in_stack_ffffffffffffffd8);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, U& result ) SAFEINT_CPP_THROW
    {
        // both are unsigned - easy case
        if( rhs <= lhs )
        {
            T tmp = (T)(lhs - rhs);
            SafeCastHelper< U, T, GetCastMethod<U, T>::method >::template CastThrow<E>( tmp, result);
            return;
        }

        E::SafeIntOnOverflow();
    }